

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall higan::HttpServer::OnMessageSendOver(HttpServer *this,TcpConnectionPtr *connection)

{
  TcpConnection *pTVar1;
  bool bVar2;
  any *__any;
  __shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ssize_t sVar4;
  HttpServer *this_00;
  undefined1 local_50 [8];
  FileContextPtr file_ptr;
  allocator<char> local_19;
  
  pTVar1 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,"HttpFileContext",&local_19);
  __any = TcpConnection::GetContext
                    (pTVar1,(string *)
                            &file_ptr.
                             super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
  p_Var3 = &std::any_cast<std::shared_ptr<higan::FileContext>>(__any)->
            super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2> *)local_50,p_Var3);
  this_00 = (HttpServer *)
            &file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  std::__cxx11::string::~string((string *)this_00);
  sVar4 = SendFileInternal(this_00,connection,(FileContextPtr *)local_50);
  if (0 < sVar4) {
    TcpConnection::SetCallSendOverCallback
              ((connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,true);
    goto LAB_0012218e;
  }
  if (sVar4 != -1) {
    if (sVar4 != 0) goto LAB_0012218e;
    TcpConnection::SetCallSendOverCallback
              ((connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,false);
    pTVar1 = (connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,"HttpFileContext",&local_19);
    TcpConnection::DeleteContext
              (pTVar1,(string *)
                      &file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &file_ptr.super___shared_ptr<higan::FileContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar2 = FileContext::CloseConnection((FileContext *)local_50);
    if (!bVar2) goto LAB_0012218e;
  }
  TcpConnection::DestroyConnection
            ((connection->super___shared_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
LAB_0012218e:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&file_ptr);
  return;
}

Assistant:

void HttpServer::OnMessageSendOver(const TcpConnectionPtr& connection)
{
	/**
	 * 如果存在相关上下文 说明文件未发送完毕 继续发送
	 */
	FileContext::FileContextPtr file_ptr = *std::any_cast<FileContext::FileContextPtr>(
			connection->GetContext("HttpFileContext"));

	ssize_t send_size = SendFileInternal(connection, file_ptr);

	if (send_size > 0)
	{
		connection->SetCallSendOverCallback(true);
	}
	else if (send_size == 0)
	{
		connection->SetCallSendOverCallback(false);
		connection->DeleteContext("HttpFileContext");

		if (file_ptr->CloseConnection())
		{
			connection->DestroyConnection();
		}
	}
	else if (send_size == -1)
	{
		connection->DestroyConnection();
	}
}